

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pending_with_parameters.cpp
# Opt level: O1

void CheckSimpleQueryAfterModification(Connection *con)

{
  SourceLineInfo *pSVar1;
  undefined1 uVar2;
  bool bVar3;
  initializer_list<duckdb::Value> __l;
  initializer_list<duckdb::Value> __l_00;
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
  pending_result;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  AssertionHandler catchAssertionHandler;
  vector<duckdb::Value,_true> values;
  allocator_type local_121;
  _Head_base<0UL,_duckdb::PendingQueryResult_*,_false> local_120;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_118;
  AssertionHandler local_110;
  SourceLineInfo local_c8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_b8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_a0;
  StringRef local_88 [4];
  StringRef local_48;
  StringRef local_38;
  
  duckdb::Value::Value((Value *)&local_110,0xe);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_110;
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            (&local_a0,__l,(allocator_type *)local_88);
  duckdb::Value::~Value((Value *)&local_110);
  pSVar1 = &local_110.m_assertionInfo.lineInfo;
  local_110.m_assertionInfo.macroName.m_start = (char *)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"SELECT COUNT(*) FROM a WHERE i=?","");
  duckdb::Connection::PendingQuery((string *)&local_120,(vector *)con,SUB81(&local_110,0));
  if ((SourceLineInfo *)local_110.m_assertionInfo.macroName.m_start != pSVar1) {
    operator_delete(local_110.m_assertionInfo.macroName.m_start);
  }
  local_88[0].m_start = "REQUIRE";
  local_88[0].m_size = 7;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_c8.line = 0x33;
  Catch::StringRef::StringRef(&local_38,"!pending_result->HasError()");
  Catch::AssertionHandler::AssertionHandler(&local_110,local_88,&local_c8,local_38,Normal);
  duckdb::
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
  operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              *)&local_120);
  uVar2 = duckdb::BaseQueryResult::HasError();
  local_88[0].m_start = (char *)(CONCAT71(local_88[0].m_start._1_7_,uVar2) ^ 1);
  Catch::AssertionHandler::handleExpr<bool>(&local_110,(ExprLhs<bool> *)local_88);
  Catch::AssertionHandler::complete(&local_110);
  if (local_110.m_completed == false) {
    (*(local_110.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  duckdb::
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>::
  operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
              *)&local_120);
  duckdb::PendingQueryResult::Execute();
  local_88[0].m_start = "REQUIRE";
  local_88[0].m_size = 7;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_pending_with_parameters.cpp"
  ;
  local_c8.line = 0x35;
  Catch::StringRef::StringRef(&local_48,"CHECK_COLUMN(result, 0, {1})");
  Catch::AssertionHandler::AssertionHandler(&local_110,local_88,&local_c8,local_48,Normal);
  duckdb::Value::Value((Value *)local_88,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_88;
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_b8,__l_00,&local_121);
  bVar3 = duckdb::CHECK_COLUMN
                    ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                      *)&local_118,0,(vector<duckdb::Value,_true> *)&local_b8);
  local_c8.file = (char *)CONCAT71(local_c8.file._1_7_,bVar3);
  Catch::AssertionHandler::handleExpr<bool>(&local_110,(ExprLhs<bool> *)&local_c8);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_b8);
  duckdb::Value::~Value((Value *)local_88);
  Catch::AssertionHandler::complete(&local_110);
  if (local_110.m_completed == false) {
    (*(local_110.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  if (local_118._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_118._M_head_impl + 8))();
  }
  if (local_120._M_head_impl != (PendingQueryResult *)0x0) {
    (**(code **)(*(long *)local_120._M_head_impl + 8))();
  }
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_a0);
  return;
}

Assistant:

static void CheckSimpleQueryAfterModification(Connection &con) {
	duckdb::vector<Value> values = {Value(14)};
	auto pending_result = con.PendingQuery("SELECT COUNT(*) FROM a WHERE i=?", values, true);
	REQUIRE(!pending_result->HasError());
	auto result = pending_result->Execute();
	REQUIRE(CHECK_COLUMN(result, 0, {1}));
}